

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_randomizer_adaptations.hpp
# Opt level: O2

void PatchRandomizerAdaptations::prevent_hint_item_save_scumming(ROM *rom)

{
  uint32_t address;
  Code *pCVar1;
  allocator<char> local_109;
  undefined1 local_108 [32];
  _Rb_tree_node_base local_e8;
  size_t local_c8;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_c0;
  Code func_save_on_buy;
  
  func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func_save_on_buy._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func_save_on_buy._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func_save_on_buy._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_save_on_buy._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func_save_on_buy._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::jsr(&func_save_on_buy,0x1592);
  local_108._0_8_ = &PTR_getXn_00246ce8;
  local_108._8_8_ = (pointer)0x200ff1903;
  md::Code::moveb(&func_save_on_buy,0xff,(Param *)local_108);
  md::Code::rts(&func_save_on_buy);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_108,"",&local_109);
  address = md::ROM::inject_code(rom,&func_save_on_buy,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  local_e8._M_left = &local_e8;
  _Stack_c0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8 = 0;
  _Stack_c0._0_8_ = 0;
  local_e8._M_color = _S_red;
  local_e8._4_4_ = 0;
  local_e8._M_parent = (_Base_ptr)0x0;
  local_108._16_8_ = 0;
  local_108._24_8_ = 0;
  local_108._0_8_ = (_func_int **)0x0;
  local_108._8_8_ = (pointer)0x0;
  _Stack_c0.super__Rb_tree_header._M_header._M_left = &_Stack_c0.super__Rb_tree_header._M_header;
  _Stack_c0.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_c0.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_c0.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_right = local_e8._M_left;
  _Stack_c0.super__Rb_tree_header._M_header._M_right =
       _Stack_c0.super__Rb_tree_header._M_header._M_left;
  pCVar1 = md::Code::jsr((Code *)local_108,address);
  pCVar1 = md::Code::nop(pCVar1,1);
  md::ROM::set_code(rom,0x24f48,pCVar1);
  md::Code::~Code((Code *)local_108);
  md::Code::~Code(&func_save_on_buy);
  return;
}

Assistant:

static void prevent_hint_item_save_scumming(md::ROM& rom)
    {
        md::Code func_save_on_buy;
        {
            func_save_on_buy.jsr(0x1592);                   // Save game
            func_save_on_buy.moveb(0xFF, addr_(0xFF1903));  // Redo instruction that was removed by injection
        }
        func_save_on_buy.rts();
        uint32_t func_save_on_buy_addr = rom.inject_code(func_save_on_buy);

        rom.set_code(0x24F48, md::Code().jsr(func_save_on_buy_addr).nop());
    }